

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dequantize.cpp
# Opt level: O2

int __thiscall
ncnn::Dequantize::forward(Dequantize *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int size;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  float *pfVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  float fVar10;
  
  iVar1 = bottom_blob->dims;
  size = bottom_blob->w;
  uVar2 = bottom_blob->h;
  uVar3 = bottom_blob->c;
  Mat::create_like(top_blob,bottom_blob,opt->blob_allocator);
  iVar7 = -100;
  if (((float *)top_blob->data != (float *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    iVar7 = 0;
    if (iVar1 == 1) {
      if (this->bias_data_size == 0) {
        fVar10 = 0.0;
      }
      else {
        fVar10 = *(this->bias_data).data;
      }
      dequantize((int *)bottom_blob->data,(float *)top_blob->data,*(this->scale_data).data,fVar10,
                 size);
    }
    else if (iVar1 == 3) {
      iVar7 = 0;
      uVar4 = (ulong)uVar3;
      if ((int)uVar3 < 1) {
        uVar4 = 0;
      }
      lVar8 = 0;
      for (uVar9 = 0; uVar4 != uVar9; uVar9 = uVar9 + 1) {
        uVar5 = uVar9;
        if (this->scale_data_size == 1) {
          uVar5 = 0;
        }
        if (this->bias_data_size == 0) {
          fVar10 = 0.0;
        }
        else {
          if (this->bias_data_size == 1) {
            pfVar6 = (float *)(this->bias_data).data;
          }
          else {
            pfVar6 = (float *)((long)(this->bias_data).data + lVar8);
          }
          fVar10 = *pfVar6;
        }
        dequantize((int *)(bottom_blob->cstep * uVar9 * bottom_blob->elemsize +
                          (long)bottom_blob->data),
                   (float *)(top_blob->cstep * uVar9 * top_blob->elemsize + (long)top_blob->data),
                   *(float *)((long)(this->scale_data).data + uVar5 * 4),fVar10,uVar2 * size);
        lVar8 = lVar8 + 4;
      }
    }
    else {
      iVar7 = 0;
      if (iVar1 == 2) {
        iVar7 = 0;
        uVar4 = (ulong)uVar2;
        if ((int)uVar2 < 1) {
          uVar4 = 0;
        }
        lVar8 = 0;
        for (uVar9 = 0; uVar4 != uVar9; uVar9 = uVar9 + 1) {
          uVar5 = uVar9;
          if (this->scale_data_size == 1) {
            uVar5 = 0;
          }
          if (this->bias_data_size == 0) {
            fVar10 = 0.0;
          }
          else {
            if (this->bias_data_size == 1) {
              pfVar6 = (float *)(this->bias_data).data;
            }
            else {
              pfVar6 = (float *)((long)(this->bias_data).data + lVar8);
            }
            fVar10 = *pfVar6;
          }
          dequantize((int *)((long)bottom_blob->w * uVar9 * bottom_blob->elemsize +
                            (long)bottom_blob->data),
                     (float *)((long)top_blob->w * uVar9 * top_blob->elemsize + (long)top_blob->data
                              ),*(float *)((long)(this->scale_data).data + uVar5 * 4),fVar10,size);
          lVar8 = lVar8 + 4;
        }
      }
    }
  }
  return iVar7;
}

Assistant:

int Dequantize::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int dims = bottom_blob.dims;
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int channels = bottom_blob.c;

    top_blob.create_like(bottom_blob, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (dims == 1)
    {
        // assert scale_data_size == 1
        // assert bias_data_size == 0 || bias_data_size == 1

        const int* intptr = bottom_blob;
        float* ptr = top_blob;

        const float scale = scale_data[0];
        const float bias = bias_data_size == 0 ? 0.f : bias_data[0];

        dequantize(intptr, ptr, scale, bias, w);
    }

    if (dims == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            const int* intptr = bottom_blob.row<const int>(i);
            float* ptr = top_blob.row(i);

            const float scale = scale_data_size == 1 ? scale_data[0] : scale_data[i];
            const float bias = bias_data_size == 0 ? 0.f : bias_data_size == 1 ? bias_data[0] : bias_data[i];

            dequantize(intptr, ptr, scale, bias, w);
        }
    }

    if (dims == 3)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const int* intptr = bottom_blob.channel(q);
            float* ptr = top_blob.channel(q);

            const float scale = scale_data_size == 1 ? scale_data[0] : scale_data[q];
            const float bias = bias_data_size == 0 ? 0.f : bias_data_size == 1 ? bias_data[0] : bias_data[q];

            dequantize(intptr, ptr, scale, bias, w * h);
        }
    }

    return 0;
}